

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestPicker::testEvenDisabled(TestPicker *this)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  Picker *pPVar4;
  QPointingDevice *pQVar5;
  qsizetype qVar6;
  QSharedPointer<QtMWidgets::Picker> *this_00;
  undefined4 in_stack_fffffffffffffdac;
  KeyboardModifiers local_1b8;
  QPoint local_1b4;
  KeyboardModifiers local_1ac;
  QString local_1a8;
  QFlags<Qt::KeyboardModifier> local_190;
  QFlags<Qt::MouseButton> local_18c;
  QPoint local_188;
  QPoint local_180;
  QPointF local_178;
  QPoint local_168;
  QPointF local_160;
  QMouseEvent local_150 [8];
  QMouseEvent me;
  KeyboardModifiers local_f4;
  offset_in_Picker_to_subr local_f0;
  code *local_e0;
  undefined8 local_d8;
  undefined1 local_d0 [8];
  QSignalSpy spy;
  QPoint c;
  undefined1 local_38 [8];
  StringListEvenDisabledModel model;
  TestPicker *this_local;
  
  model._32_8_ = this;
  StringListEvenDisabledModel::StringListEvenDisabledModel
            ((StringListEvenDisabledModel *)local_38,(QObject *)0x0);
  QStringListModel::setStringList((QList_conflict *)local_38);
  pPVar4 = QSharedPointer<QtMWidgets::Picker>::operator->(&this->m_picker);
  QtMWidgets::Picker::setModel(pPVar4,(QAbstractItemModel *)local_38);
  pPVar4 = QSharedPointer<QtMWidgets::Picker>::operator->(&this->m_picker);
  QtMWidgets::Picker::setCurrentIndex(pPVar4,3);
  this_00 = &this->m_picker;
  pPVar4 = QSharedPointer<QtMWidgets::Picker>::operator->(this_00);
  iVar2 = QWidget::width(&pPVar4->super_QWidget);
  pPVar4 = QSharedPointer<QtMWidgets::Picker>::operator->(this_00);
  iVar3 = QWidget::height(&pPVar4->super_QWidget);
  QPoint::QPoint((QPoint *)&spy.field_0x7c,iVar2 / 2,iVar3 / 2);
  pPVar4 = QSharedPointer<QtMWidgets::Picker>::data(this_00);
  local_e0 = QtMWidgets::Picker::currentIndexChanged;
  local_d8 = 0;
  local_f0 = QNonConstOverload<int>::of<void,QtMWidgets::Picker>
                       ((QNonConstOverload<int> *)QtMWidgets::Picker::currentIndexChanged,0);
  QSignalSpy::QSignalSpy<void(QtMWidgets::Picker::*)(int)>((QSignalSpy *)local_d0,pPVar4,local_f0);
  pPVar4 = QSharedPointer<QtMWidgets::Picker>::data(&this->m_picker);
  QFlags<Qt::KeyboardModifier>::QFlags(&local_f4);
  QTest::mousePress(&pPVar4->super_QWidget,LeftButton,local_f4,stack0xffffffffffffffb4,-1);
  local_168 = operator+((QPoint *)&spy.field_0x7c,&this->m_delta);
  QPointF::QPointF(&local_160,&local_168);
  pPVar4 = QSharedPointer<QtMWidgets::Picker>::operator->(&this->m_picker);
  local_188 = operator+((QPoint *)&spy.field_0x7c,&this->m_delta);
  local_180 = (QPoint)QWidget::mapToGlobal((QPoint *)pPVar4);
  QPointF::QPointF(&local_178,&local_180);
  QFlags<Qt::MouseButton>::QFlags(&local_18c,LeftButton);
  QFlags<Qt::KeyboardModifier>::QFlags(&local_190);
  QString::QString(&local_1a8);
  pQVar5 = (QPointingDevice *)QPointingDevice::primaryPointingDevice((QString *)&local_1a8);
  QMouseEvent::QMouseEvent
            (local_150,MouseMove,(QPointF *)&local_160,(QPointF *)&local_178,LeftButton,
             (QFlags_conflict1 *)(ulong)local_18c.i,
             (QFlags_conflict1 *)CONCAT44(in_stack_fffffffffffffdac,local_190.i),pQVar5);
  QString::~QString(&local_1a8);
  pPVar4 = QSharedPointer<QtMWidgets::Picker>::data(&this->m_picker);
  QCoreApplication::sendEvent((QObject *)pPVar4,(QEvent *)local_150);
  QTest::qWait(500);
  pPVar4 = QSharedPointer<QtMWidgets::Picker>::data(&this->m_picker);
  QFlags<Qt::KeyboardModifier>::QFlags(&local_1ac);
  local_1b4 = operator+((QPoint *)&spy.field_0x7c,&this->m_delta);
  QTest::mouseRelease(&pPVar4->super_QWidget,LeftButton,local_1ac,local_1b4,0x14);
  pPVar4 = QSharedPointer<QtMWidgets::Picker>::data(&this->m_picker);
  QFlags<Qt::KeyboardModifier>::QFlags(&local_1b8);
  QTest::mouseClick(&pPVar4->super_QWidget,LeftButton,local_1b8,stack0xffffffffffffffb4,0x14);
  qVar6 = QList<QList<QVariant>_>::count((QList<QList<QVariant>_> *)&spy.field_0x8);
  bVar1 = QTest::qVerify(qVar6 == 0,"spy.count() == 0","",
                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/picker/main.cpp"
                         ,0xce);
  if ((bVar1 & 1) != 0) {
    pPVar4 = QSharedPointer<QtMWidgets::Picker>::operator->(&this->m_picker);
    QtMWidgets::Picker::setModel(pPVar4,(QAbstractItemModel *)&this->m_model);
  }
  QMouseEvent::~QMouseEvent(local_150);
  QSignalSpy::~QSignalSpy((QSignalSpy *)local_d0);
  StringListEvenDisabledModel::~StringListEvenDisabledModel((StringListEvenDisabledModel *)local_38)
  ;
  return;
}

Assistant:

void testEvenDisabled()
	{
		StringListEvenDisabledModel model;
		model.setStringList( m_data );

		m_picker->setModel( &model );

		m_picker->setCurrentIndex( 3 );

		QPoint c( m_picker->width() / 2, m_picker->height() / 2 );

		QSignalSpy spy( m_picker.data(), QOverload< int >::of(
			&QtMWidgets::Picker::currentIndexChanged ) );

		QTest::mousePress( m_picker.data(), Qt::LeftButton, {}, c );
		QMouseEvent me( QEvent::MouseMove, c + m_delta, m_picker->mapToGlobal( c + m_delta ),
			Qt::LeftButton, Qt::LeftButton, {} );
		QApplication::sendEvent( m_picker.data(), &me );
		QTest::qWait( 500 );
		QTest::mouseRelease( m_picker.data(), Qt::LeftButton, {}, c + m_delta, 20 );
		QTest::mouseClick( m_picker.data(), Qt::LeftButton, {}, c, 20 );

		QVERIFY( spy.count() == 0 );

		m_picker->setModel( &m_model );
	}